

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CropResizeLayerParams::SharedCtor(CropResizeLayerParams *this)

{
  CropResizeLayerParams *this_local;
  
  memset(&this->mode_,0,0x18);
  this->_cached_size_ = 0;
  return;
}

Assistant:

void CropResizeLayerParams::SharedCtor() {
  ::memset(&mode_, 0, reinterpret_cast<char*>(&spatialscale_) -
    reinterpret_cast<char*>(&mode_) + sizeof(spatialscale_));
  _cached_size_ = 0;
}